

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.h
# Opt level: O2

bool __thiscall
CCommandBuffer::AddCommand<CCommandBuffer::CRenderCommand>
          (CCommandBuffer *this,CRenderCommand *Command)

{
  undefined4 uVar1;
  CCommand *pCVar2;
  long lVar3;
  CCommand *pCVar4;
  byte bVar5;
  
  bVar5 = 0;
  pCVar2 = (CCommand *)CBuffer::Alloc(&this->m_CmdBuffer,0x60,8);
  if (pCVar2 != (CCommand *)0x0) {
    pCVar4 = pCVar2;
    for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar1 = *(undefined4 *)&(Command->super_CCommand).field_0x4;
      pCVar4->m_Cmd = (Command->super_CCommand).m_Cmd;
      *(undefined4 *)&pCVar4->field_0x4 = uVar1;
      Command = (CRenderCommand *)((long)Command + (ulong)bVar5 * -0x10 + 8);
      pCVar4 = (CCommand *)&pCVar4[-(ulong)bVar5].m_pNext;
    }
    pCVar2->m_pNext = (CCommand *)0x0;
    if (this->m_pCmdBufferTail != (CCommand *)0x0) {
      this->m_pCmdBufferTail->m_pNext = pCVar2;
    }
    if (this->m_pCmdBufferHead == (CCommand *)0x0) {
      this->m_pCmdBufferHead = pCVar2;
    }
    this->m_pCmdBufferTail = pCVar2;
  }
  return pCVar2 != (CCommand *)0x0;
}

Assistant:

bool AddCommand(const T &Command)
	{
		// make sure that we don't do something stupid like ->AddCommand(&Cmd);
		(void)static_cast<const CCommand *>(&Command);

		// allocate and copy the command into the buffer
		T *pCmd = (T *)m_CmdBuffer.Alloc(sizeof(*pCmd), 8); // TODO: use alignof(T)
		if(!pCmd)
			return false;
		*pCmd = Command;
		pCmd->m_pNext = 0;

		if(m_pCmdBufferTail)
			m_pCmdBufferTail->m_pNext = pCmd;
		if(!m_pCmdBufferHead)
			m_pCmdBufferHead = pCmd;
		m_pCmdBufferTail = pCmd;

		return true;
	}